

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

bool __thiscall VcprojGenerator::otherFiltersContain(VcprojGenerator *this,QString *fileName)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  QString *s1;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  VCFilter *local_88 [10];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88[0] = &(this->vcProject).RootFiles;
  local_88[1] = &(this->vcProject).SourceFiles;
  local_88[2] = &(this->vcProject).HeaderFiles;
  local_88[3] = &(this->vcProject).GeneratedFiles;
  local_88[4] = &(this->vcProject).LexYaccFiles;
  local_88[5] = &(this->vcProject).TranslationFiles;
  local_88[6] = &(this->vcProject).FormFiles;
  local_88[7] = &(this->vcProject).ResourceFiles;
  local_88[8] = &(this->vcProject).DeploymentFiles;
  local_88[9] = &(this->vcProject).DistributionFiles;
  for (lVar6 = 0; lVar6 != 0x50; lVar6 = lVar6 + 8) {
    lVar2 = *(long *)(*(long *)((long)local_88 + lVar6) + 0x68);
    lVar7 = *(long *)(*(long *)((long)local_88 + lVar6) + 0x70);
    lVar4 = lVar7 * 0x20;
    lVar1 = lVar2 + lVar4;
    lVar5 = 0;
    for (lVar7 = lVar7 >> 2; s1 = (QString *)(lVar2 + lVar5 + 8), 0 < lVar7; lVar7 = lVar7 + -1) {
      bVar3 = comparesEqual(s1,fileName);
      if (bVar3) {
        lVar7 = lVar2 + lVar5;
        goto LAB_001d0a12;
      }
      bVar3 = comparesEqual((QString *)(lVar2 + lVar5 + 0x28),fileName);
      if (bVar3) {
        lVar7 = lVar2 + lVar5 + 0x20;
        goto LAB_001d0a12;
      }
      bVar3 = comparesEqual((QString *)(lVar2 + lVar5 + 0x48),fileName);
      if (bVar3) {
        lVar7 = lVar2 + lVar5 + 0x40;
        goto LAB_001d0a12;
      }
      bVar3 = comparesEqual((QString *)(lVar2 + lVar5 + 0x68),fileName);
      if (bVar3) {
        lVar7 = lVar2 + lVar5 + 0x60;
        goto LAB_001d0a12;
      }
      lVar5 = lVar5 + 0x80;
    }
    lVar4 = lVar4 - lVar5 >> 5;
    lVar7 = lVar2 + lVar5;
    if (lVar4 == 1) {
LAB_001d0a4d:
      bVar3 = comparesEqual((QString *)(lVar7 + 8),fileName);
      if (!bVar3) {
        lVar7 = lVar1;
      }
LAB_001d0a12:
      if (lVar7 != lVar1) break;
    }
    else {
      if (lVar4 == 3) {
        bVar3 = comparesEqual(s1,fileName);
        if (!bVar3) {
          lVar7 = lVar2 + lVar5 + 0x20;
          goto LAB_001d0a39;
        }
        goto LAB_001d0a12;
      }
      if (lVar4 == 2) {
LAB_001d0a39:
        bVar3 = comparesEqual((QString *)(lVar7 + 8),fileName);
        if (!bVar3) {
          lVar7 = lVar7 + 0x20;
          goto LAB_001d0a4d;
        }
        goto LAB_001d0a12;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar6 != 0x50;
}

Assistant:

bool VcprojGenerator::otherFiltersContain(const QString &fileName) const
{
    auto filterFileMatches = [&fileName] (const VCFilterFile &ff)
    {
        return ff.file == fileName;
    };
    for (const VCFilter *filter : { &vcProject.RootFiles,
                                    &vcProject.SourceFiles,
                                    &vcProject.HeaderFiles,
                                    &vcProject.GeneratedFiles,
                                    &vcProject.LexYaccFiles,
                                    &vcProject.TranslationFiles,
                                    &vcProject.FormFiles,
                                    &vcProject.ResourceFiles,
                                    &vcProject.DeploymentFiles,
                                    &vcProject.DistributionFiles}) {
        if (std::any_of(filter->Files.cbegin(), filter->Files.cend(), filterFileMatches))
            return true;
    }
    return false;
}